

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2builder_graph.cc
# Opt level: O1

vector<int,_std::allocator<int>_> * __thiscall
S2Builder::Graph::GetInputEdgeOrder
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,Graph *this,
          vector<int,_std::allocator<int>_> *input_ids)

{
  int iVar1;
  int iVar2;
  int iVar3;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __first;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __last;
  pointer piVar4;
  long lVar5;
  int iVar6;
  ulong uVar7;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var8;
  int *piVar9;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __i;
  allocator_type local_29;
  
  std::vector<int,_std::allocator<int>_>::vector
            (__return_storage_ptr__,
             (long)(input_ids->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(input_ids->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_start >> 2,&local_29);
  __first._M_current =
       (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
       super__Vector_impl_data._M_start;
  __last._M_current =
       (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (__first._M_current != __last._M_current) {
    iVar6 = 0;
    _Var8._M_current = __first._M_current;
    do {
      *_Var8._M_current = iVar6;
      iVar6 = iVar6 + 1;
      _Var8._M_current = _Var8._M_current + 1;
    } while (_Var8._M_current != __last._M_current);
    if (__first._M_current != __last._M_current) {
      uVar7 = (long)__last._M_current - (long)__first._M_current >> 2;
      lVar5 = 0x3f;
      if (uVar7 != 0) {
        for (; uVar7 >> lVar5 == 0; lVar5 = lVar5 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<S2Builder::Graph::GetInputEdgeOrder(std::vector<int,std::allocator<int>>const&)const::__0>>
                (__first,__last,(ulong)(((uint)lVar5 ^ 0x3f) * 2) ^ 0x7e,
                 (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_figroc[P]s2geometry_src_s2_s2builder_graph_cc:166:41)>
                  )input_ids);
      if ((long)__last._M_current - (long)__first._M_current < 0x41) {
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_comp_iter<S2Builder::Graph::GetInputEdgeOrder(std::vector<int,std::allocator<int>>const&)const::__0>>
                  (__first,__last,
                   (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_figroc[P]s2geometry_src_s2_s2builder_graph_cc:166:41)>
                    )input_ids);
      }
      else {
        _Var8._M_current = __first._M_current + 0x10;
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_comp_iter<S2Builder::Graph::GetInputEdgeOrder(std::vector<int,std::allocator<int>>const&)const::__0>>
                  (__first,_Var8,
                   (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_figroc[P]s2geometry_src_s2_s2builder_graph_cc:166:41)>
                    )input_ids);
        if (_Var8._M_current != __last._M_current) {
          piVar4 = (input_ids->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          do {
            iVar6 = *_Var8._M_current;
            piVar9 = _Var8._M_current;
            while( true ) {
              iVar1 = piVar9[-1];
              iVar2 = piVar4[iVar6];
              iVar3 = piVar4[iVar1];
              if ((iVar3 <= iVar2) && ((iVar1 <= iVar6 || (iVar3 < iVar2)))) break;
              *piVar9 = iVar1;
              piVar9 = piVar9 + -1;
            }
            *piVar9 = iVar6;
            _Var8._M_current = _Var8._M_current + 1;
          } while (_Var8._M_current != __last._M_current);
        }
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

vector<Graph::EdgeId> Graph::GetInputEdgeOrder(
    const vector<InputEdgeId>& input_ids) const {
  vector<EdgeId> order(input_ids.size());
  std::iota(order.begin(), order.end(), 0);
  std::sort(order.begin(), order.end(), [&input_ids](EdgeId a, EdgeId b) {
      // Comparison function ensures sort is stable.
      return make_pair(input_ids[a], a) < make_pair(input_ids[b], b);
    });
  return order;
}